

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

AssimpVertexBoneWeightList * __thiscall
Assimp::Ogre::IVertexData::AssimpBoneWeights
          (AssimpVertexBoneWeightList *__return_storage_ptr__,IVertexData *this,size_t vertices)

{
  uint pID;
  bool bVar1;
  pointer pVVar2;
  mapped_type *this_00;
  aiVertexWeight local_80;
  mapped_type *local_78;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *boneWeights;
  __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
  local_68;
  const_iterator end;
  __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
  local_58;
  const_iterator iter;
  key_type local_3c;
  mapped_type *local_38;
  VertexBoneAssignmentList *vertexWeights;
  size_t vi;
  VertexBoneAssignmentList *local_20;
  size_t vertices_local;
  IVertexData *this_local;
  AssimpVertexBoneWeightList *weights;
  
  vi._7_1_ = 0;
  local_20 = (VertexBoneAssignmentList *)vertices;
  vertices_local = (size_t)this;
  this_local = (IVertexData *)__return_storage_ptr__;
  std::
  map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  ::map(__return_storage_ptr__);
  for (vertexWeights = (VertexBoneAssignmentList *)0x0; vertexWeights < local_20;
      vertexWeights =
           (VertexBoneAssignmentList *)
           ((long)&(vertexWeights->
                   super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1)) {
    local_3c = (key_type)vertexWeights;
    local_38 = std::
               map<unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>_>_>
               ::operator[](&this->boneAssignmentsMap,&local_3c);
    end._M_current =
         (VertexBoneAssignment *)
         std::
         vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
         ::begin(local_38);
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
    ::__normal_iterator<Assimp::Ogre::VertexBoneAssignment*>
              ((__normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
                *)&local_58,
               (__normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                *)&end);
    boneWeights = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                  std::
                  vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                  ::end(local_38);
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
    ::__normal_iterator<Assimp::Ogre::VertexBoneAssignment*>
              ((__normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
                *)&local_68,
               (__normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                *)&boneWeights);
    while (bVar1 = __gnu_cxx::operator!=(&local_58,&local_68), bVar1) {
      pVVar2 = __gnu_cxx::
               __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
               ::operator->(&local_58);
      this_00 = std::
                map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](__return_storage_ptr__,&pVVar2->boneIndex);
      pID = (key_type)vertexWeights;
      local_78 = this_00;
      pVVar2 = __gnu_cxx::
               __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
               ::operator->(&local_58);
      aiVertexWeight::aiVertexWeight(&local_80,pID,pVVar2->weight);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(this_00,&local_80);
      __gnu_cxx::
      __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
      ::operator++(&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssimpVertexBoneWeightList IVertexData::AssimpBoneWeights(size_t vertices)
{
    AssimpVertexBoneWeightList weights;
    for(size_t vi=0; vi<vertices; ++vi)
    {
        VertexBoneAssignmentList &vertexWeights = boneAssignmentsMap[static_cast<unsigned int>(vi)];
        for (VertexBoneAssignmentList::const_iterator iter=vertexWeights.begin(), end=vertexWeights.end();
            iter!=end; ++iter)
        {
            std::vector<aiVertexWeight> &boneWeights = weights[iter->boneIndex];
            boneWeights.push_back(aiVertexWeight(static_cast<unsigned int>(vi), iter->weight));
        }
    }
    return weights;
}